

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_test.cpp
# Opt level: O0

void __thiscall PackedArray_speed_Test::TestBody(PackedArray_speed_Test *this)

{
  pointer *this_00;
  uint32_t offset;
  result_type rVar1;
  PackedArray *a_00;
  reference pvVar2;
  ostream *poVar3;
  double dVar4;
  uint local_1dcc;
  int i;
  PackedArray *pa;
  int bits;
  uint local_1db4;
  undefined1 local_1db0 [4];
  int a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> val;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offs;
  uint els;
  uint tot;
  uniform_int_distribution<unsigned_int> distr;
  undefined1 local_1d60 [8];
  mt19937_64 eng;
  random_device rd;
  PackedArray_speed_Test *this_local;
  
  std::random_device::random_device((random_device *)&eng._M_p);
  rVar1 = std::random_device::operator()((random_device *)&eng._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)local_1d60,(ulong)rVar1);
  std::uniform_int_distribution<unsigned_int>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_int> *)&els);
  this_00 = &val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,0x8000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1db0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1db0,0x8000000);
  for (local_1db4 = 0; local_1db4 < 0x800; local_1db4 = local_1db4 + 1) {
    bits = std::uniform_int_distribution<unsigned_int>::operator()
                     ((uniform_int_distribution<unsigned_int> *)&els,
                      (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                       *)local_1d60);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1db0,(value_type *)&bits
              );
    rVar1 = std::uniform_int_distribution<unsigned_int>::operator()
                      ((uniform_int_distribution<unsigned_int> *)&els,
                       (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)local_1d60);
    pa._4_4_ = rVar1 & 0x7ff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)((long)&pa + 4));
  }
  for (pa._0_4_ = 1; (int)(uint32_t)pa < 0x20; pa._0_4_ = (uint32_t)pa + 1) {
    a_00 = PackedArray_create((uint32_t)pa,0x800);
    for (local_1dcc = 0; local_1dcc < 0x8000000; local_1dcc = local_1dcc + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)local_1dcc);
      offset = *pvVar2;
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1db0,
                          (long)(int)local_1dcc);
      PackedArray_set(a_00,offset,*pvVar2);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"bits=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint32_t)pa);
    poVar3 = std::operator<<(poVar3,"speed: ");
    dVar4 = relClockOffset();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,128.0 / dVar4);
    poVar3 = std::operator<<(poVar3,"MEl");
    std::operator<<(poVar3,"\n");
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1db0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::random_device::~random_device((random_device *)&eng._M_p);
  return;
}

Assistant:

TEST(PackedArray, speed) {
    std::random_device rd;     //Get a random seed from the OS entropy device, or whatever
    std::mt19937_64 eng(rd());
    std::uniform_int_distribution<uint32_t> distr;

    const unsigned tot = 128*1024*1024;
    const unsigned els = 2048;

    vector<uint32_t> offs;
    offs.reserve(tot);
    vector<uint32_t> val;
    val.reserve(tot);

    for (int a = 0; a < els; a++) {
        val.push_back(distr(eng));
        offs.push_back(distr(eng) & (els-1));
    }

    for (int bits = 1; bits < 32; bits++) {

        PackedArray *pa = PackedArray_create(bits, els);
        for(int i =0; i<tot; i++) {
            PackedArray_set(pa, offs[i], val[i]);
        }

        cerr << "bits="<<bits <<"speed: "<< tot / 1024 / 1024/ relClockOffset() << "MEl"<< "\n";
    }
}